

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr)

{
  bool bVar1;
  int iVar2;
  code *pcVar3;
  undefined8 *puVar4;
  XML_Error unaff_EBP;
  char **ppcVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  char *s;
  char *next;
  XML_Char c;
  char **local_58;
  char **local_50;
  char *local_48;
  char **local_40;
  char **local_38;
  
  local_58 = (char **)*startPtr;
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    puVar7 = (undefined8 *)((long)parser + 0x218);
    *(char ***)((long)parser + 0x218) = local_58;
    puVar4 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    puVar7 = *(undefined8 **)((long)parser + 0x230);
    puVar4 = puVar7 + 1;
  }
  *puVar7 = local_58;
  *startPtr = (char *)0x0;
  local_40 = startPtr;
  local_38 = nextPtr;
  do {
    iVar2 = (*enc->scanners[2])(enc,(char *)local_58,end,(char **)&local_50);
    *puVar4 = local_50;
    switch(iVar2) {
    case 0:
      *puVar7 = local_50;
      unaff_EBP = XML_ERROR_INVALID_TOKEN;
      break;
    case 6:
      pcVar3 = *(code **)((long)parser + 0x78);
      if (pcVar3 == (code *)0x0) {
LAB_00152036:
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,(char *)local_58,(char *)local_50);
        }
      }
      else {
        if (enc->isUtf8 != '\0') {
          uVar6 = *(undefined8 *)((long)parser + 8);
          iVar2 = (int)local_50 - (int)local_58;
          ppcVar5 = local_58;
          goto LAB_00151fe6;
        }
        while( true ) {
          local_48 = *(char **)((long)parser + 0x58);
          (*enc->utf8Convert)(enc,(char **)&local_58,(char *)local_50,&local_48,
                              *(char **)((long)parser + 0x60));
          *puVar4 = local_50;
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
                     (int)local_48 - (int)*(undefined8 *)((long)parser + 0x58));
          if (local_58 == local_50) break;
          *puVar7 = local_58;
        }
      }
      goto LAB_0015204f;
    case 7:
      pcVar3 = *(code **)((long)parser + 0x78);
      if (pcVar3 == (code *)0x0) goto LAB_00152036;
      local_48 = (char *)CONCAT71(local_48._1_7_,10);
      uVar6 = *(undefined8 *)((long)parser + 8);
      iVar2 = 1;
      ppcVar5 = &local_48;
LAB_00151fe6:
      (*pcVar3)(uVar6,ppcVar5,iVar2);
LAB_0015204f:
      local_58 = local_50;
      *puVar7 = local_50;
      bVar1 = true;
      goto LAB_00152090;
    case -4:
    case -1:
      if (local_38 == (char **)0x0) {
        unaff_EBP = XML_ERROR_UNCLOSED_CDATA_SECTION;
      }
      else {
LAB_00151f8b:
        unaff_EBP = XML_ERROR_NONE;
        *local_38 = (char *)local_58;
      }
      break;
    case -3:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
switchD_00151f36_caseD_fffffffd:
      *puVar7 = local_50;
      unaff_EBP = XML_ERROR_UNEXPECTED_STATE;
      break;
    case -2:
      if (local_38 != (char **)0x0) goto LAB_00151f8b;
      unaff_EBP = XML_ERROR_PARTIAL_CHAR;
      break;
    default:
      if (iVar2 != 0x28) goto switchD_00151f36_caseD_fffffffd;
      if (*(code **)((long)parser + 0x98) == (code *)0x0) {
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,(char *)local_58,(char *)local_50);
        }
      }
      else {
        (**(code **)((long)parser + 0x98))(*(undefined8 *)((long)parser + 8));
      }
      *local_40 = (char *)local_50;
      unaff_EBP = XML_ERROR_NONE;
    }
    bVar1 = false;
LAB_00152090:
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static
enum XML_Error doCdataSection(XML_Parser parser,
                              const ENCODING *enc,
                              const char **startPtr,
                              const char *end,
                              const char **nextPtr)
{
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    *eventPP = s;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = 0;
  for (;;) {
    const char *next;
    int tok = XmlCdataSectionTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (endCdataSectionHandler)
        endCdataSectionHandler(handlerArg);
#if 0
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (characterDataHandler)
        characterDataHandler(handlerArg, dataBuf, 0);
#endif
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = next;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    *eventPP = s = next;
  }
  /* not reached */
}